

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint64_t uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint32_t hbits;
  long lVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint32_t nn;
  int iVar10;
  int iVar11;
  Node *node;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  lua_Number nk;
  int local_a8 [12];
  uint32_t bins [28];
  
  bins[0xc] = 0;
  bins[0xd] = 0;
  bins[0xe] = 0;
  bins[0xf] = 0;
  bins[8] = 0;
  bins[9] = 0;
  bins[10] = 0;
  bins[0xb] = 0;
  bins[4] = 0;
  bins[5] = 0;
  bins[6] = 0;
  bins[7] = 0;
  bins[0] = 0;
  bins[1] = 0;
  bins[2] = 0;
  bins[3] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  uVar14 = t->asize;
  iVar3 = 0;
  if (uVar14 != 0) {
    lVar5 = 0;
    uVar12 = 0;
    iVar3 = 0;
    do {
      uVar7 = 2 << ((byte)lVar5 & 0x1f);
      uVar8 = (uint)uVar12;
      if ((uVar14 <= uVar7) && (uVar7 = uVar14 - 1, uVar14 - 1 < uVar8)) break;
      iVar9 = 0;
      if (uVar8 <= uVar7) {
        iVar9 = 0;
        do {
          iVar9 = iVar9 + (uint)(*(long *)((t->array).ptr64 + uVar12 * 8) != -1);
          uVar13 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar13;
        } while (uVar13 <= uVar7);
        uVar12 = (ulong)(uVar8 + 1);
        if (uVar8 + 1 <= uVar7 + 1) {
          uVar12 = (ulong)(uVar7 + 1);
        }
      }
      local_a8[lVar5] = local_a8[lVar5] + iVar9;
      iVar3 = iVar3 + iVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x1c);
  }
  uVar1 = (t->node).ptr64;
  uVar6 = t->hmask;
  lVar5 = 0;
  iVar9 = 0;
  iVar10 = 0;
  do {
    if (*(long *)(uVar1 + lVar5) != -1) {
      dVar2 = *(double *)(uVar1 + 8 + lVar5);
      iVar4 = 0;
      if (((((ulong)dVar2 < 0xfff9000000000000) && (uVar14 = (uint)dVar2, uVar14 < 0x8000001)) &&
          (dVar2 == (double)(int)dVar2)) && (iVar4 = 0, !NAN(dVar2) && !NAN((double)(int)dVar2))) {
        uVar7 = 0x1f;
        if (uVar14 - 1 != 0) {
          for (; uVar14 - 1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar12 = (ulong)uVar7;
        if (uVar14 < 3) {
          uVar12 = 0;
        }
        local_a8[uVar12] = local_a8[uVar12] + 1;
        iVar4 = 1;
      }
      iVar10 = iVar10 + iVar4;
      iVar9 = iVar9 + 1;
    }
    lVar5 = lVar5 + 0x18;
  } while ((ulong)(uVar6 + 1 + (uint)(uVar6 == 0xffffffff)) * 0x18 != lVar5);
  dVar2 = ek->n;
  iVar4 = 0;
  iVar11 = 0;
  if ((((ulong)dVar2 < 0xfff9000000000000) && (uVar14 = (uint)dVar2, uVar14 < 0x8000001)) &&
     ((dVar2 == (double)(int)dVar2 && (!NAN(dVar2) && !NAN((double)(int)dVar2))))) {
    uVar7 = 0x1f;
    if (uVar14 - 1 != 0) {
      for (; uVar14 - 1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar12 = 0;
    if (2 < uVar14) {
      uVar12 = (ulong)uVar7;
    }
    local_a8[uVar12] = local_a8[uVar12] + 1;
    iVar11 = 1;
  }
  iVar11 = iVar10 + iVar3 + iVar11;
  uVar6 = 0;
  uVar14 = iVar11 * 2;
  if (uVar14 != 0) {
    uVar7 = 0;
    uVar8 = 1;
    uVar6 = 0;
    iVar4 = 0;
    iVar10 = 0;
    do {
      if (local_a8[uVar7] != 0) {
        iVar10 = iVar10 + local_a8[uVar7];
        if (uVar8 < (uint)(iVar10 * 2)) {
          uVar6 = (2 << ((byte)uVar7 & 0x1f)) + 1;
          iVar4 = iVar10;
        }
      }
      uVar7 = uVar7 + 1;
      uVar8 = 1 << ((byte)uVar7 & 0x1f);
    } while ((uVar8 < uVar14) && (iVar10 != iVar11));
  }
  hbits = 0;
  iVar4 = (iVar3 + iVar9 + 1) - iVar4;
  if ((iVar4 != 0) && (hbits = 1, iVar4 != 1)) {
    uVar14 = 0x1f;
    if (iVar4 - 1U != 0) {
      for (; iVar4 - 1U >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    hbits = (uVar14 ^ 0xffffffe0) + 0x21;
  }
  lj_tab_resize(L,t,uVar6,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  lj_tab_resize(L, t, asize, hsize2hbits(total));
}